

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Common.cpp
# Opt level: O1

void __thiscall
psy::C::Parser::maybeAmbiguateTypeReference(Parser *this,TypeReferenceSyntax **tyRef)

{
  SyntaxKind SVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  TypeNameSyntax *pTVar6;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar7;
  AbstractDeclaratorSyntax *pAVar8;
  TypeNameAsTypeReferenceSyntax *pTVar9;
  AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax *node;
  ostream *poVar10;
  TypedefNameSyntax *tydefName;
  TypedefNameSyntax *local_38;
  long lVar4;
  
  SVar1 = SyntaxNode::kind(&(*tyRef)->super_SyntaxNode);
  if (SVar1 == ExpressionAsTypeReference) {
    iVar2 = (*((*tyRef)->super_SyntaxNode).super_Managed._vptr_Managed[0xcc])();
    SVar1 = SyntaxNode::kind(*(SyntaxNode **)(CONCAT44(extraout_var,iVar2) + 0x18));
    if (SVar1 == ParenthesizedExpression) {
      iVar2 = (*((*tyRef)->super_SyntaxNode).super_Managed._vptr_Managed[0xcc])();
      iVar3 = (*(((ExpressionAsTypeReferenceSyntax *)CONCAT44(extraout_var_00,iVar2))->expr_->
                super_SyntaxNode).super_Managed._vptr_Managed[0x76])();
      lVar4 = CONCAT44(extraout_var_01,iVar3);
      lVar5 = (**(code **)(**(long **)(lVar4 + 0x30) + 0x410))();
      if (lVar5 != 0) {
        local_38 = makeNode<psy::C::TypedefNameSyntax>(this);
        lVar5 = (**(code **)(**(long **)(lVar4 + 0x30) + 0x410))();
        local_38->identTkIdx_ = *(IndexType *)(lVar5 + 0x28);
        pTVar6 = makeNode<psy::C::TypeNameSyntax>(this);
        pSVar7 = makeNode<psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>,psy::C::TypedefNameSyntax*&>
                           (this,&local_38);
        pTVar6->specs_ = pSVar7;
        pAVar8 = makeNode<psy::C::AbstractDeclaratorSyntax>(this);
        pTVar6->decltor_ = &pAVar8->super_DeclaratorSyntax;
        pTVar9 = makeNode<psy::C::TypeNameAsTypeReferenceSyntax>(this);
        pTVar9->openParenTkIdx_ = *(IndexType *)(lVar4 + 0x28);
        pTVar9->typeName_ = pTVar6;
        pTVar9->closeParenTkIdx_ = *(IndexType *)(lVar4 + 0x38);
        node = makeNode<psy::C::AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax>(this);
        *tyRef = &node->super_TypeReferenceSyntax;
        node->exprAsTyRef_ = (ExpressionAsTypeReferenceSyntax *)CONCAT44(extraout_var_00,iVar2);
        node->tyNameAsTyRef_ = pTVar9;
        DiagnosticsReporter::AmbiguousTypeNameOrExpressionAsTypeReference(&this->diagReporter_,node)
        ;
      }
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Common.cpp"
             ,0x5e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"",0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  return;
}

Assistant:

void Parser::maybeAmbiguateTypeReference(TypeReferenceSyntax*& tyRef)
{
    PSY_ASSERT_3(tyRef->kind() == SyntaxKind::ExpressionAsTypeReference
                    && (tyRef->asExpressionAsTypeReference()->expr_->kind()
                            == SyntaxKind::ParenthesizedExpression),
                  return, "");

    auto exprAsTyRef = tyRef->asExpressionAsTypeReference();
    auto parenExpr = exprAsTyRef->expr_->asParenthesizedExpression();
    if (!parenExpr->expr_->asIdentifierName())
        return;

    auto tydefName = makeNode<TypedefNameSyntax>();
    tydefName->identTkIdx_ = parenExpr->expr_->asIdentifierName()->identTkIdx_;
    auto tyName = makeNode<TypeNameSyntax>();
    tyName->specs_ =  makeNode<SpecifierListSyntax>(tydefName);
    tyName->decltor_ = makeNode<AbstractDeclaratorSyntax>();
    auto tyNameAsTyRef = makeNode<TypeNameAsTypeReferenceSyntax>();
    tyNameAsTyRef->openParenTkIdx_ = parenExpr->openParenTkIdx_;
    tyNameAsTyRef->typeName_ = tyName;
    tyNameAsTyRef->closeParenTkIdx_ = parenExpr->closeParenTkIdx_;

    auto ambigTyRef = makeNode<AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax>();
    tyRef = ambigTyRef;
    ambigTyRef->exprAsTyRef_ = exprAsTyRef;
    ambigTyRef->tyNameAsTyRef_ = tyNameAsTyRef;

    diagReporter_.AmbiguousTypeNameOrExpressionAsTypeReference(ambigTyRef);
}